

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workitem.h
# Opt level: O2

void __thiscall depspawn::internal::Workitem::post(Workitem *this)

{
  this->status = Ready;
  TaskPool::enqueue(TP,this->task);
  return;
}

Assistant:

void post() {
        status = Status_t::Ready;
#ifdef DEPSPAWN_USE_TBB
        if (EnqueueTasks) {
          tbb::task::enqueue((tbb::task&)*task);
        } else {
          master_task->spawn((tbb::task&)*task);
        }
#else
        TP->enqueue((AbstractRunner *)task);
#endif
      }